

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTry
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  Try *tryy;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  tryy = (Try *)MixedArena::allocSpace(this_00,0x78,8);
  (tryy->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id = TryId;
  (tryy->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (tryy->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (tryy->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements = 0
  ;
  (tryy->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id = 0;
  (tryy->name).super_IString.str._M_len = 0;
  (tryy->name).super_IString.str._M_str = (char *)0x0;
  (tryy->catchTags).allocator = this_00;
  (tryy->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (tryy->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (tryy->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (tryy->catchBodies).allocator = this_00;
  (tryy->delegateTarget).super_IString.str._M_len = 0;
  (tryy->delegateTarget).super_IString.str._M_str = (char *)0x0;
  (tryy->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id =
       sig.results.id.id;
  visitTryStart(__return_storage_ptr__,this,tryy,label,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTry(Name label, Signature sig) {
  auto* tryy = wasm.allocator.alloc<Try>();
  tryy->type = sig.results;
  return visitTryStart(tryy, label, sig.params);
}